

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

AMPLS_MP_Solver *
AMPLS__internal__Open
          (unique_ptr<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_> p_be,CCallbacks cb)

{
  long lVar1;
  long *plVar2;
  AMPLS_MP_Solver *pAVar3;
  long *__s;
  
  pAVar3 = (AMPLS_MP_Solver *)operator_new(0x18);
  pAVar3->internal_info_ = (void *)0x0;
  pAVar3->solver_info_ = (void *)0x0;
  pAVar3->user_info_ = (void *)0x0;
  __s = (long *)operator_new(0xb8);
  memset(__s,0,0xb8);
  __s[1] = (long)&PTR__OutputHandler_004517f8;
  *(undefined1 *)(__s + 2) = 0;
  __s[3] = 0;
  __s[4] = 0;
  __s[5] = 0;
  __s[6] = 0;
  __s[7] = 0;
  __s[8] = 0;
  __s[9] = 0;
  __s[10] = 0;
  __s[0xb] = 0;
  __s[0xc] = 0;
  __s[0xd] = 0;
  __s[0xe] = 0;
  __s[0xf] = 0;
  __s[0x10] = 0;
  __s[0x11] = 0;
  __s[0x12] = 0;
  __s[0x13] = (long)(__s + 0x15);
  __s[0x14] = 0;
  *(undefined1 *)(__s + 0x15) = 0;
  pAVar3->internal_info_ = __s;
  lVar1 = *(long *)p_be._M_t.
                   super___uniq_ptr_impl<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>
                   .super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl;
  *(undefined8 *)
   p_be._M_t.super___uniq_ptr_impl<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_>._M_t.
   super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
   super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = 0;
  plVar2 = (long *)*__s;
  *__s = lVar1;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  plVar2 = (long *)*__s;
  *(undefined4 *)(plVar2 + 0x5f) = cb.additionalText._0_4_;
  *(undefined4 *)((long)plVar2 + 0x2fc) = cb.additionalText._4_4_;
  *(undefined4 *)(plVar2 + 0x60) = cb.diagnostics._0_4_;
  *(undefined4 *)((long)plVar2 + 0x304) = cb.diagnostics._4_4_;
  plVar2[0x5d] = (long)cb.init;
  plVar2[0x5e] = (long)cb.check;
  plVar2[0x4a] = (long)(__s + 1);
  (**(code **)(*plVar2 + 0x60))(plVar2);
  *(undefined4 *)(plVar2 + 0x30) = 1;
  return pAVar3;
}

Assistant:

AMPLS_MP_Solver* AMPLS__internal__Open(std::unique_ptr<mp::BasicBackend> p_be,
  CCallbacks cb = {}) {
  AMPLS_MP_Solver* slv = new AMPLS_MP_Solver();
  AMPLS__internal__TryCatchWrapper( slv, [&]() {
    auto ii = new AMPLS_MP__internal();
    slv->internal_info_ = ii;
    ii->p_be_ = std::move(p_be);
    auto be = ii->p_be_.get();
    be->GetCallbacks() = cb;
    be->set_output_handler(&ii->output_h_);
    char* argv[] = {(char*)"ampls-driver", nullptr};
    be->Init(argv);
    be->set_wantsol(1);       // user can still modify by 'wantsol=...'
    return 0;
  } );
  return slv;
}